

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O2

bool match_place_holder(Am_Value *placeholder_value,Am_Value *current_value)

{
  bool bVar1;
  ostream *poVar2;
  Am_Value *value;
  Am_Object placeholder;
  Am_Placeholder_Replace_Method method;
  Am_Object local_20;
  Am_Placeholder_Replace_Method local_18;
  
  Am_Object::Am_Object(&local_20,placeholder_value);
  poVar2 = std::operator<<((ostream *)&std::cout,"  Matching placeholder ");
  poVar2 = operator<<(poVar2,&local_20);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ostream::flush();
  value = Am_Object::Get(&local_20,Am_PLACEHOLDER_MATCH_METHOD,0);
  Am_Placeholder_Replace_Method::Am_Placeholder_Replace_Method(&local_18,value);
  if (local_18.Call != (Am_Placeholder_Replace_Method_Type *)0x0) {
    bVar1 = (*local_18.Call)(&local_20,current_value,&Am_No_Object);
    poVar2 = std::operator<<((ostream *)&std::cout,"  method ");
    poVar2 = operator<<(poVar2,&local_18);
    poVar2 = std::operator<<(poVar2," returned ");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ostream::flush();
    Am_Object::~Am_Object(&local_20);
    return bVar1;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
  poVar2 = std::operator<<(poVar2,"Placeholder ");
  poVar2 = operator<<(poVar2,&local_20);
  poVar2 = std::operator<<(poVar2," has no match method.");
  std::endl<char,std::char_traits<char>>(poVar2);
  Am_Error();
}

Assistant:

bool
match_place_holder(Am_Value &placeholder_value, Am_Value &current_value)
{
  Am_Object placeholder = placeholder_value;
  std::cout << "  Matching placeholder " << placeholder << std::endl
            << std::flush;
  Am_Placeholder_Replace_Method method =
      placeholder.Get(Am_PLACEHOLDER_MATCH_METHOD);
  if (!method.Valid())
    Am_ERROR("Placeholder " << placeholder << " has no match method.");
  bool match = method.Call(placeholder, current_value, Am_No_Object);
  std::cout << "  method " << method << " returned " << match << std::endl
            << std::flush;
  return match;
}